

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nesintf.c
# Opt level: O3

UINT8 device_start_nes_nsfplay(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  uint clock;
  DEV_DATA __ptr;
  undefined8 *chip;
  undefined8 *chip_00;
  undefined8 *puVar1;
  void *pvVar2;
  uint rate;
  
  clock = cfg->clock;
  rate = clock >> 2;
  if (cfg->srMode == '\x02') {
    if (rate <= cfg->smplRate) {
      rate = cfg->smplRate;
    }
  }
  else if (cfg->srMode == '\x01') {
    rate = cfg->smplRate;
  }
  __ptr.chipInf = calloc(1,0x30);
  if ((DEV_DATA *)__ptr.chipInf != (DEV_DATA *)0x0) {
    chip = (undefined8 *)NES_APU_np_Create(clock,rate);
    ((DEV_DATA *)((long)__ptr.chipInf + 8))->chipInf = chip;
    if (chip != (undefined8 *)0x0) {
      chip_00 = (undefined8 *)NES_DMC_np_Create(cfg->clock,rate);
      ((DEV_DATA *)((long)__ptr.chipInf + 0x10))->chipInf = chip_00;
      if (chip_00 != (undefined8 *)0x0) {
        NES_DMC_np_SetAPU(chip_00,chip);
        if (cfg->flags == '\0') {
          puVar1 = (undefined8 *)0x0;
        }
        else {
          puVar1 = (undefined8 *)NES_FDS_Create(cfg->clock,rate);
        }
        ((DEV_DATA *)((long)__ptr.chipInf + 0x18))->chipInf = puVar1;
        pvVar2 = calloc(1,0x8000);
        ((DEV_DATA *)((long)__ptr.chipInf + 0x20))->chipInf = pvVar2;
        NES_DMC_np_SetMemory(chip_00,(UINT8 *)((long)pvVar2 + -0x8000));
        *(void **)__ptr.chipInf = __ptr.chipInf;
        *chip = __ptr.chipInf;
        *chip_00 = __ptr.chipInf;
        if (puVar1 != (undefined8 *)0x0) {
          *puVar1 = __ptr.chipInf;
        }
        retDevInf->dataPtr = (DEV_DATA *)__ptr.chipInf;
        retDevInf->sampleRate = rate;
        retDevInf->devDef = &devDef_NSFPlay;
        retDevInf->linkDevCount = 0;
        retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
        return '\0';
      }
      NES_APU_np_Destroy(chip);
    }
    free(__ptr.chipInf);
  }
  return 0xff;
}

Assistant:

static UINT8 device_start_nes_nsfplay(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	NESAPU_INF* info;
	DEV_DATA* devData;
	UINT32 rate;
	
	rate = cfg->clock / 4;
	SRATE_CUSTOM_HIGHEST(cfg->srMode, rate, cfg->smplRate);
	
	info = (NESAPU_INF*)calloc(1, sizeof(NESAPU_INF));
	if (info == NULL)
		return 0xFF;
	info->chip_apu = NES_APU_np_Create(cfg->clock, rate);
	if (info->chip_apu == NULL)
	{
		free(info);
		return 0xFF;
	}
	info->chip_dmc = NES_DMC_np_Create(cfg->clock, rate);
	if (info->chip_dmc == NULL)
	{
		NES_APU_np_Destroy(info->chip_apu);
		free(info);
		return 0xFF;
	}
	NES_DMC_np_SetAPU(info->chip_dmc, info->chip_apu);
	
#ifdef EC_NES_NSFP_FDS
	if (cfg->flags)	// enable FDS sound
		info->chip_fds = NES_FDS_Create(cfg->clock, rate);
	else
#endif
		info->chip_fds = NULL;
	
	info->memory = (UINT8*)malloc(0x8000);
	memset(info->memory, 0x00, 0x8000);
	NES_DMC_np_SetMemory(info->chip_dmc, info->memory - 0x8000);
	
	info->fds_disable = 0;
	
	// store pointer to NESAPU_INF into sound chip structures
	info->_devData.chipInf = info;
	devData = (DEV_DATA*)info->chip_apu;
	devData->chipInf = info;
	devData = (DEV_DATA*)info->chip_dmc;
	devData->chipInf = info;
	if (info->chip_fds != NULL)
	{
		devData = (DEV_DATA*)info->chip_fds;
		devData->chipInf = info;
	}
	INIT_DEVINF(retDevInf, &info->_devData, rate, &devDef_NSFPlay);
	return 0x00;
}